

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

void __thiscall Imf_3_4::Header::setType(Header *this,string *type)

{
  bool bVar1;
  ArgExc *this_00;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  TStack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = isSupportedType(type);
  if (bVar1) {
    TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::TypedAttribute(&TStack_168,type);
    insert(this,"type",&TStack_168.super_Attribute);
    TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~TypedAttribute(&TStack_168);
    bVar1 = isDeepData(type);
    if (bVar1) {
      bVar1 = hasVersion(this);
      if (!bVar1) {
        setVersion(this,1);
      }
    }
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  std::operator+(&local_140,type,"is not a supported image type.");
  std::operator+(&local_120,&local_140,"The following are supported: ");
  std::operator+(&local_100,&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 SCANLINEIMAGE_abi_cxx11_);
  std::operator+(&local_e0,&local_100,", ");
  std::operator+(&local_c0,&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 TILEDIMAGE_abi_cxx11_);
  std::operator+(&local_a0,&local_c0,", ");
  std::operator+(&local_80,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 DEEPSCANLINE_abi_cxx11_);
  std::operator+(&local_60,&local_80," or ");
  std::operator+(&local_40,&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 DEEPTILE_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_168,
                 &local_40,".");
  Iex_3_4::ArgExc::ArgExc(this_00,(string *)&TStack_168);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
Header::setType (const string& type)
{
    if (isSupportedType (type) == false)
    {
        throw IEX_NAMESPACE::ArgExc (
            type + "is not a supported image type." +
            "The following are supported: " + SCANLINEIMAGE + ", " +
            TILEDIMAGE + ", " + DEEPSCANLINE + " or " + DEEPTILE + ".");
    }

    insert ("type", StringAttribute (type));

    // (TODO) Should we do it here?
    if (isDeepData (type) && hasVersion () == false) { setVersion (1); }
}